

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

Atomic * rw::Atomic::streamReadClump(Stream *stream,FrameList_ *frameList,Geometry **geometryList)

{
  FILE *pFVar1;
  bool bVar2;
  char *pcVar3;
  Atomic *this;
  uint32 length;
  Error local_60;
  Error _e_1;
  Geometry *g;
  Atomic *atomic;
  undefined4 local_40;
  Error _e;
  uint32 version;
  int32 buf [4];
  Geometry **geometryList_local;
  FrameList_ *frameList_local;
  Stream *stream_local;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,&_e.plugin);
  if (!bVar2) {
    atomic._4_4_ = 2;
    local_40 = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0x207);
    pFVar1 = _stderr;
    pcVar3 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar3);
    setError((Error *)((long)&atomic + 4));
    return (Atomic *)0x0;
  }
  length = 0x10;
  if (_e.plugin < 0x30400) {
    length = 0xc;
  }
  Stream::read32(stream,&_e.code,length);
  this = create();
  if (this == (Atomic *)0x0) {
    return (Atomic *)0x0;
  }
  setFrame(this,frameList->frames[(int)_e.code]);
  if (_e.plugin < 0x30400) {
    bVar2 = findChunk(stream,0xf,(uint32 *)0x0,(uint32 *)0x0);
    if (!bVar2) {
      local_60.plugin = 2;
      local_60.code = 0x80000004;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0x212);
      pFVar1 = _stderr;
      pcVar3 = dbgsprint(0x80000004,"STRUCT");
      fprintf(pFVar1,"%s\n",pcVar3);
      setError(&local_60);
      goto LAB_0014b922;
    }
    _e_1 = (Error)Geometry::streamRead(stream);
    if (_e_1 == (Error)0x0) goto LAB_0014b922;
    setGeometry(this,(Geometry *)_e_1,0);
    Geometry::destroy((Geometry *)_e_1);
  }
  else {
    setGeometry(this,geometryList[(int)version],0);
  }
  (this->object).object.flags = (uint8)buf[0];
  atomicRights = 0;
  bVar2 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
  if (bVar2) {
    if (atomicRights == 0) {
      return this;
    }
    PluginList::assertRights((PluginList *)&s_plglist,this,atomicRights,DAT_0016660c);
    return this;
  }
LAB_0014b922:
  destroy(this);
  return (Atomic *)0x0;
}

Assistant:

Atomic*
Atomic::streamReadClump(Stream *stream,
                        FrameList_ *frameList, Geometry **geometryList)
{
	int32 buf[4];
	uint32 version;
	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(buf, version < 0x30400 ? 12 : 16);
	Atomic *atomic = Atomic::create();
	if(atomic == nil)
		return nil;
	atomic->setFrame(frameList->frames[buf[0]]);
	Geometry *g;
	if(version < 0x30400){
		if(!findChunk(stream, ID_GEOMETRY, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto fail;
		}
		g = Geometry::streamRead(stream);
		if(g == nil)
			goto fail;
		atomic->setGeometry(g, 0);
		g->destroy();
	}else
		atomic->setGeometry(geometryList[buf[1]], 0);
	atomic->object.object.flags = buf[2];

	atomicRights[0] = 0;
	if(!s_plglist.streamRead(stream, atomic))
		goto fail;
	if(atomicRights[0])
		s_plglist.assertRights(atomic, atomicRights[0], atomicRights[1]);
	return atomic;

fail:
	atomic->destroy();
	return nil;
}